

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall UtilTest_SystemError_Test::TestBody(UtilTest_SystemError_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  system_error e;
  FormatErrorMessage in_stack_00000228;
  int in_stack_00000234;
  char *in_stack_ffffffffffffff08;
  basic_string_view<char> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar3;
  int line;
  char *in_stack_ffffffffffffff30;
  Type in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar4;
  char (*in_stack_ffffffffffffff48) [9];
  undefined8 in_stack_ffffffffffffff68;
  system_error *in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff78;
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  string local_60 [32];
  AssertionResult local_40 [2];
  system_error local_20;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  fmt::v5::basic_string_view<char>::basic_string_view
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  line = 0x21;
  fmt::v5::system_error::system_error<>(in_stack_ffffffffffffff70,iVar2,in_stack_ffffffffffffff78);
  get_system_error_abi_cxx11_(in_stack_ffffffffffffff3c);
  fmt::v5::format<char[9],std::__cxx11::string>
            (in_stack_ffffffffffffff48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::runtime_error::what();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char_const*>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff28),in_stack_ffffffffffffff20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             &in_stack_ffffffffffffff10->data_);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_40);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff28);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff20 =
         testing::AssertionResult::failure_message((AssertionResult *)0x127f02);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,line,in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x127f50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127f93);
  uVar4 = 0x21;
  iVar2 = fmt::v5::system_error::error_code(&local_20);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(line,uVar3),in_stack_ffffffffffffff20,
             (int *)CONCAT44(iVar2,in_stack_ffffffffffffff18),(int *)in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff48);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,iVar2));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x128034)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,iVar2),in_stack_ffffffffffffff3c,
               in_stack_ffffffffffffff30,line,in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x128082);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1280c2);
  check_throw_error<fmt::v5::system_error>(in_stack_00000234,in_stack_00000228);
  fmt::v5::system_error::~system_error((system_error *)0x1280e2);
  return;
}

Assistant:

TEST(UtilTest, SystemError) {
  fmt::system_error e(EDOM, "test");
  EXPECT_EQ(fmt::format("test: {}", get_system_error(EDOM)), e.what());
  EXPECT_EQ(EDOM, e.error_code());
  check_throw_error<fmt::system_error>(EDOM, fmt::format_system_error);
}